

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

int __thiscall ON_WindingNumber::WindingNumber(ON_WindingNumber *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = this->m_left_crossing_number;
  uVar1 = this->m_right_crossing_number;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  if (uVar2 < uVar4) {
    uVar3 = uVar1;
  }
  uVar1 = this->m_above_crossing_number;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  if (uVar2 < uVar4) {
    uVar3 = uVar1;
  }
  uVar1 = this->m_below_crossing_number;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  if (uVar2 < uVar4) {
    uVar3 = uVar1;
  }
  return uVar3;
}

Assistant:

int ON_WindingNumber::WindingNumber() const
{
  int winding_number = m_left_crossing_number;
  if (abs(m_right_crossing_number) < abs(winding_number))
    winding_number = m_right_crossing_number;
  if (abs(m_above_crossing_number) < abs(winding_number))
    winding_number = m_above_crossing_number;
  if (abs(m_below_crossing_number) < abs(winding_number))
    winding_number = m_below_crossing_number;
  return winding_number;
}